

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

void __thiscall TypeChecker::visit(TypeChecker *this,VariableDeclarationNode *param_1)

{
  VariableDeclarationNode *param_1_local;
  TypeChecker *this_local;
  
  return;
}

Assistant:

void TypeChecker::visit(const VariableNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  VariableAnalyser analyser{};
  symbol.accept(analyser);
  if(analyser.isSymbolValid())
    type_ = analyser.getType().value();
  else
  {
    FunctionAnalyser analyser{};
    symbol.accept(analyser);
    if(analyser.isSymbolValid())
      type_ = TypeName::Function;
    else
      reportError("Invalid symbol reference!", node);
  }
}